

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# knn.cpp
# Opt level: O0

Vector __thiscall KNNClassifier::predict(KNNClassifier *this,SparseMatrix *X)

{
  uint uVar1;
  Index IVar2;
  Scalar *pSVar3;
  SparseMatrix<double,_1,_int> *in_RDX;
  Index extraout_RDX;
  Vector VVar4;
  int local_34;
  Index IStack_30;
  int i;
  undefined1 local_21;
  SparseMatrix *X_local;
  KNNClassifier *this_local;
  Vector *result;
  
  local_21 = 0;
  X_local = X;
  this_local = this;
  IStack_30 = Eigen::SparseMatrix<double,_1,_int>::rows(in_RDX);
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix<long>
            ((Matrix<double,__1,_1,_0,__1,_1> *)this,&stack0xffffffffffffffd0);
  for (local_34 = 0; IVar2 = Eigen::SparseMatrix<double,_1,_int>::rows(in_RDX), local_34 < IVar2;
      local_34 = local_34 + 1) {
    uVar1 = predecirFila((KNNClassifier *)X,in_RDX,local_34);
    pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)this,
                        (long)local_34);
    *pSVar3 = (double)uVar1;
  }
  VVar4.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows =
       extraout_RDX;
  VVar4.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
       (double *)this;
  return (Vector)VVar4.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage;
}

Assistant:

Vector KNNClassifier::predict(SparseMatrix X)
{
  auto result = Vector(X.rows());

  for (int i = 0; i < X.rows(); i++)
    result(i) = predecirFila(X, i);

  return result;
}